

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::csharp::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  long lVar4;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string filename;
  string filename_error;
  Options cli_options;
  string local_f8;
  string local_d8;
  Printer printer;
  ZeroCopyOutputStream *output;
  
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseGeneratorParameter(parameter,&options);
  if (*(int *)(file + 0x8c) != 3) {
    bVar1 = IsDescriptorProto(file);
    if (!bVar1) {
      std::__cxx11::string::assign((char *)error);
      bVar1 = false;
      goto LAB_00249715;
    }
  }
  Options::Options(&cli_options);
  lVar4 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)options.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)options.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 6); uVar3 = uVar3 + 1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&((options.
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus
                                    ._M_p + lVar4),"file_extension");
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&cli_options);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&((options.
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->first).
                                      _M_dataplus._M_p + lVar4),"base_namespace");
      if (bVar1) {
        std::__cxx11::string::_M_assign((string *)&cli_options.base_namespace);
        cli_options.base_namespace_specified = true;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&((options.
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->first).
                                         _M_dataplus._M_p + lVar4),"internal_access");
        if (!bVar1) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &printer,"Unknown generator option: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((options.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus.
                                 _M_p + lVar4));
          std::__cxx11::string::operator=((string *)error,(string *)&printer);
          std::__cxx11::string::~string((string *)&printer);
          bVar1 = false;
          goto LAB_0024970b;
        }
        cli_options.internal_access = true;
      }
    }
    lVar4 = lVar4 + 0x40;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename_error,"",(allocator<char> *)&printer);
  std::__cxx11::string::string((string *)&local_d8,(string *)&cli_options);
  bVar1 = cli_options.base_namespace_specified;
  std::__cxx11::string::string((string *)&local_f8,(string *)&cli_options.base_namespace);
  GetOutputFile(&filename,file,&local_d8,bVar1,&local_f8,&filename_error);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  bVar1 = filename._M_string_length != 0;
  if (filename._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)error);
  }
  else {
    iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&filename);
    output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
    io::Printer::Printer(&printer,output,'$');
    GenerateFile(file,&printer,&cli_options);
    io::Printer::~Printer(&printer);
    if (output != (ZeroCopyOutputStream *)0x0) {
      (*output->_vptr_ZeroCopyOutputStream[1])(output);
    }
  }
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&filename_error);
LAB_0024970b:
  Options::~Options(&cli_options);
LAB_00249715:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&options);
  return bVar1;
}

Assistant:

bool Generator::Generate(
    const FileDescriptor* file,
    const string& parameter,
    GeneratorContext* generator_context,
    string* error) const {

  vector<pair<string, string> > options;
  ParseGeneratorParameter(parameter, &options);

  // We only support proto3 - but we make an exception for descriptor.proto.
  if (file->syntax() != FileDescriptor::SYNTAX_PROTO3 && !IsDescriptorProto(file)) {
    *error = "C# code generation only supports proto3 syntax";
    return false;
  }

  struct Options cli_options;

  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "file_extension") {
      cli_options.file_extension = options[i].second;
    } else if (options[i].first == "base_namespace") {
      cli_options.base_namespace = options[i].second;
      cli_options.base_namespace_specified = true;
    } else if (options[i].first == "internal_access") {
      cli_options.internal_access = true;
    } else {
      *error = "Unknown generator option: " + options[i].first;
      return false;
    }
  }

  string filename_error = "";
  std::string filename = GetOutputFile(file,
      cli_options.file_extension,
      cli_options.base_namespace_specified,
      cli_options.base_namespace,
      &filename_error);

  if (filename.empty()) {
    *error = filename_error;
    return false;
  }
  scoped_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '$');

  GenerateFile(file, &printer, &cli_options);

  return true;
}